

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  pointer pUVar1;
  int iVar2;
  pointer pUVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  
  pUVar3 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar1 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar3 == pUVar1) {
    sVar5 = 0;
  }
  else {
    sVar5 = (long)pUVar1 + (0x18 - (long)pUVar3);
    pUVar3 = (this->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish != pUVar3) {
      lVar7 = 8;
      uVar6 = 0;
      do {
        iVar2 = *(int *)((long)pUVar3 + lVar7 + -4);
        if (iVar2 == 4) {
          iVar2 = SpaceUsedExcludingSelf(*(UnknownFieldSet **)((long)&pUVar3->number_ + lVar7));
          sVar5 = sVar5 + (long)iVar2 + 0x18;
        }
        else if (iVar2 == 3) {
          sVar4 = internal::StringSpaceUsedExcludingSelfLong
                            (*(string **)((long)&pUVar3->number_ + lVar7));
          sVar5 = sVar5 + sVar4 + 0x20;
        }
        uVar6 = uVar6 + 1;
        pUVar3 = (this->fields_).
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x10;
      } while (uVar6 < (ulong)((long)(this->fields_).
                                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 4)
              );
    }
  }
  return sVar5;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_.empty()) return 0;

  size_t total_size = sizeof(fields_) + sizeof(UnknownField) * fields_.size();

  for (int i = 0; i < fields_.size(); i++) {
    const UnknownField& field = (fields_)[i];
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.length_delimited_.string_value) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.length_delimited_.string_value);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group_->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}